

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O3

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *heapBucket)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  long lVar2;
  uint uVar3;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    uVar3 = HeapInfo::GetMediumBucketIndex((ulong)(heapBucket->super_HeapBucket).sizeCat);
    pSVar4 = (this->mediumNormalData).bucketData[uVar3].pendingSweepList;
    if (pSVar4 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar5 = 1;
      do {
        lVar7 = lVar5;
        pSVar1 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
        if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
        pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
        lVar5 = lVar7 + 1;
      } while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
    }
    pSVar4 = (this->mediumNormalData).bucketData[uVar3].pendingEmptyBlockList;
    if (pSVar4 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar2 = 1;
      do {
        lVar5 = lVar2;
        pSVar1 = (pSVar4->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
        if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
        pSVar4 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar1->super_HeapBlock)
        ;
        lVar2 = lVar5 + 1;
      } while (pSVar4 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
    }
    sVar6 = lVar5 + lVar7;
  }
  else {
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}